

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  long in_FS_OFFSET;
  GroupInfo *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  XmlFormatting in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  allocator *paVar1;
  XmlWriter *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  XmlWriter *in_stack_ffffffffffffffa0;
  string local_48 [32];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  StreamingReporterBase<Catch::XmlReporter>::testGroupStarting
            ((StreamingReporterBase<Catch::XmlReporter> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Group",(allocator *)&stack0xffffffffffffffa7);
  operator|(Newline,Indent);
  XmlWriter::startElement
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  paVar1 = (allocator *)&stack0xffffffffffffff93;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"name",paVar1);
  XmlWriter::writeAttribute
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff93);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testGroupStarting( GroupInfo const& groupInfo ) {
        StreamingReporterBase::testGroupStarting( groupInfo );
        m_xml.startElement( "Group" )
            .writeAttribute( "name", groupInfo.name );
    }